

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.h
# Opt level: O1

void __thiscall
di::Context::addFactoryPriv<A,B>(Context *this,FactoryFunction<A,_B> factoryFunction)

{
  mapped_type *pmVar1;
  runtime_error *this_00;
  long *plVar2;
  FactoryFunction<A,_B> p_Var3;
  type_index instanceTypeIdx;
  anon_class_16_2_9ea09bd3 local_70;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  key_type local_30;
  
  local_30._M_target = (type_info *)&A::typeinfo;
  pmVar1 = std::
           map<std::type_index,_di::Context::CtxItem,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
           ::operator[](&this->items,&local_30);
  if ((pmVar1->factory).super__Function_base._M_manager == (_Manager_type)0x0) {
    local_70.factoryFunction = factoryFunction;
    local_70.this = this;
    std::function<void()>::operator=((function<void()> *)&pmVar1->factory,&local_70);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Factory already registed for type: ","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
  local_70.factoryFunction = (FactoryFunction<A,_B>)*plVar2;
  p_Var3 = (FactoryFunction<A,_B>)(plVar2 + 2);
  if (local_70.factoryFunction == p_Var3) {
    local_60 = *(long *)p_Var3;
    lStack_58 = plVar2[3];
    local_70.factoryFunction = (FactoryFunction<A,_B>)&local_60;
  }
  else {
    local_60 = *(long *)p_Var3;
  }
  local_70.this = (Context *)plVar2[1];
  *plVar2 = (long)p_Var3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_70);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void addFactoryPriv(FactoryFunction<InstanceType, Args...> factoryFunction)
    {
        auto instanceTypeIdx = std::type_index(typeid(InstanceType));

#ifdef HAS_TR2
        declareBaseTypes< typename std::tr2::bases<InstanceType>::type >( instanceTypeIdx );
#else
        declareBaseTypes<InstanceType>( instanceTypeIdx );
#endif

        CtxItem& item = items[ instanceTypeIdx ];

        if (item.factory)
            throw std::runtime_error(std::string("Factory already registed for type: ") + typeid(InstanceType).name());

        item.factory = [factoryFunction, this]()
        {
            addInstance(factoryFunction( get<Args>()... ), true);
        };
    }